

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestRepeatedString::Clear(TestRepeatedString *this)

{
  uint32_t cached_has_bits;
  TestRepeatedString *this_local;
  
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_string1_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_string2_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_bytes11_);
  google::protobuf::
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Clear(&(this->field_0)._impl_.repeated_bytes12_);
  google::protobuf::internal::InternalMetadata::Clear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TestRepeatedString::Clear() {
// @@protoc_insertion_point(message_clear_start:proto2_unittest.TestRepeatedString)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  _impl_.repeated_string1_.Clear();
  _impl_.repeated_string2_.Clear();
  _impl_.repeated_bytes11_.Clear();
  _impl_.repeated_bytes12_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}